

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH8Factory::BVH8InstanceMB(BVH8Factory *this,Scene *scene,bool isExpensive)

{
  BVH8 *bvh;
  Builder *builder;
  AccelInstance *this_00;
  GTypeMask GVar1;
  Intersectors intersectors;
  Intersectors local_140;
  
  bvh = (BVH8 *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&InstancePrimitive::type,scene);
  BVH8InstanceMBIntersectors(&local_140,this,bvh);
  GVar1 = MTY_INSTANCE;
  if (isExpensive) {
    GVar1 = MTY_INSTANCE_EXPENSIVE;
  }
  builder = (*this->BVH8InstanceMBSceneBuilderSAH)(bvh,scene,GVar1);
  this_00 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_00,(AccelData *)bvh,builder,&local_140);
  return &this_00->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8InstanceMB(Scene* scene, bool isExpensive)
  {
    BVH8* accel = new BVH8(InstancePrimitive::type,scene);
    Accel::Intersectors intersectors = BVH8InstanceMBIntersectors(accel);
    auto gtype = isExpensive ? Geometry::MTY_INSTANCE_EXPENSIVE : Geometry::MTY_INSTANCE; 
    Builder* builder = BVH8InstanceMBSceneBuilderSAH(accel,scene,gtype);
    return new AccelInstance(accel,builder,intersectors);
  }